

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O0

PrgDisj * __thiscall
Clasp::Asp::LogicProgram::getDisjFor(LogicProgram *this,AtomSpan *head,uint32 headHash)

{
  bool bVar1;
  uint32 uVar2;
  pod_vector<Clasp::Asp::PrgDisj_*,_std::allocator<Clasp::Asp::PrgDisj_*>_> *this_00;
  pointer ppVar3;
  reference ppPVar4;
  pod_vector<Clasp::Asp::PrgDisj_*,_std::allocator<Clasp::Asp::PrgDisj_*>_> *ppVar5;
  unordered_multimap<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *this_01;
  uint in_EDX;
  Span<unsigned_int> *in_RSI;
  long in_RDI;
  iterator end_1;
  iterator it_1;
  PrgEdge edge;
  iterator end;
  iterator it;
  PrgDisj *o;
  IndexRange eqRange;
  PrgDisj *d;
  PrgHead *in_stack_ffffffffffffff58;
  LogicProgram *in_stack_ffffffffffffff60;
  AtomSpan *in_stack_ffffffffffffff68;
  pod_vector<Clasp::Asp::PrgDisj_*,_std::allocator<Clasp::Asp::PrgDisj_*>_>
  *in_stack_ffffffffffffff70;
  uint32 local_70;
  pair<const_unsigned_int,_unsigned_int> local_6c;
  uint32 local_64;
  uint *local_60;
  uint *local_58;
  uint32 local_4c;
  uint *local_48;
  uint *local_40;
  PrgNode *local_38;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>_>
  local_30;
  PrgNode *local_20;
  uint local_14;
  Span<unsigned_int> *local_10;
  
  local_20 = (PrgNode *)0x0;
  local_14 = in_EDX;
  local_10 = in_RSI;
  if (in_EDX != 0) {
    local_30 = std::
               unordered_multimap<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::equal_range((unordered_multimap<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                              *)in_stack_ffffffffffffff60,(key_type *)in_stack_ffffffffffffff58);
    while (bVar1 = std::__detail::operator!=
                             ((_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                               *)&local_30,
                              &local_30.second.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                             ), bVar1) {
      this_00 = (pod_vector<Clasp::Asp::PrgDisj_*,_std::allocator<Clasp::Asp::PrgDisj_*>_> *)
                (in_RDI + 0xd0);
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::operator->
                         ((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                           *)0x17e225);
      ppPVar4 = bk_lib::pod_vector<Clasp::Asp::PrgDisj_*,_std::allocator<Clasp::Asp::PrgDisj_*>_>::
                operator[](this_00,ppVar3->second);
      local_38 = (PrgNode *)*ppPVar4;
      bVar1 = PrgNode::relevant(local_38);
      if (bVar1) {
        uVar2 = PrgDisj::size((PrgDisj *)local_38);
        in_stack_ffffffffffffff70 =
             (pod_vector<Clasp::Asp::PrgDisj_*,_std::allocator<Clasp::Asp::PrgDisj_*>_> *)
             (ulong)uVar2;
        ppVar5 = (pod_vector<Clasp::Asp::PrgDisj_*,_std::allocator<Clasp::Asp::PrgDisj_*>_> *)
                 Potassco::size<unsigned_int>(local_10);
        if (in_stack_ffffffffffffff70 == ppVar5) {
          in_stack_ffffffffffffff60 = (LogicProgram *)(in_RDI + 0x98);
          in_stack_ffffffffffffff68 = (AtomSpan *)PrgDisj::begin((PrgDisj *)local_38);
          PrgDisj::end((PrgDisj *)in_stack_ffffffffffffff60);
          bVar1 = AtomState::allMarked<unsigned_int_const*>
                            ((AtomState *)this_00,(uint *)in_stack_ffffffffffffff70,
                             (uint *)in_stack_ffffffffffffff68,
                             (uint8)((ulong)in_stack_ffffffffffffff60 >> 0x38));
          if (bVar1) {
            local_20 = local_38;
            break;
          }
        }
      }
      std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
      operator++((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false> *)
                 in_stack_ffffffffffffff60);
    }
    local_40 = Potassco::begin<unsigned_int>(local_10);
    local_48 = Potassco::end<unsigned_int>((Span<unsigned_int> *)0x17e2fd);
    for (; local_40 != local_48; local_40 = local_40 + 1) {
      AtomState::clearRule
                ((AtomState *)in_stack_ffffffffffffff60,
                 (Var)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    }
  }
  if (local_20 == (PrgNode *)0x0) {
    *(int *)(in_RDI + 100 + (long)*(int *)(in_RDI + 0x178) * 4) =
         *(int *)(in_RDI + 100 + (long)*(int *)(in_RDI + 0x178) * 4) + 1;
    bk_lib::pod_vector<Clasp::Asp::PrgDisj_*,_std::allocator<Clasp::Asp::PrgDisj_*>_>::size
              ((pod_vector<Clasp::Asp::PrgDisj_*,_std::allocator<Clasp::Asp::PrgDisj_*>_> *)
               (in_RDI + 0xd0));
    local_20 = (PrgNode *)
               PrgDisj::create((uint32)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                               in_stack_ffffffffffffff68);
    bk_lib::pod_vector<Clasp::Asp::PrgDisj_*,_std::allocator<Clasp::Asp::PrgDisj_*>_>::push_back
              (in_stack_ffffffffffffff70,(PrgDisj **)in_stack_ffffffffffffff68);
    local_4c = (uint32)PrgEdge::newEdge<Clasp::Asp::PrgDisj>
                                 ((PrgDisj *)in_stack_ffffffffffffff58,Normal);
    local_58 = Potassco::begin<unsigned_int>(local_10);
    local_60 = Potassco::end<unsigned_int>((Span<unsigned_int> *)0x17e3cf);
    for (; local_58 != local_60; local_58 = local_58 + 1) {
      getAtom(in_stack_ffffffffffffff60,(Id_t)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      local_64 = local_4c;
      PrgHead::addSupport(in_stack_ffffffffffffff58,
                          (PrgEdge)(uint32)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    }
    if (local_14 != 0) {
      this_01 = (unordered_multimap<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 *)(*(long *)(in_RDI + 0xa8) + 0x38);
      local_70 = PrgNode::id(local_20);
      std::pair<const_unsigned_int,_unsigned_int>::pair<unsigned_int_&,_unsigned_int,_true>
                (&local_6c,&local_14,&local_70);
      std::
      unordered_multimap<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::insert(this_01,(value_type *)0x17e469);
    }
  }
  return (PrgDisj *)local_20;
}

Assistant:

PrgDisj* LogicProgram::getDisjFor(const Potassco::AtomSpan& head, uint32 headHash) {
	PrgDisj* d = 0;
	if (headHash) {
		IndexRange eqRange = index_->disj.equal_range(headHash);
		for (; eqRange.first != eqRange.second; ++eqRange.first) {
			PrgDisj& o = *disjunctions_[eqRange.first->second];
			if (o.relevant() && o.size() == Potassco::size(head) && atomState_.allMarked(o.begin(), o.end(), AtomState::head_flag)) {
				assert(o.id() == eqRange.first->second);
				d = &o;
				break;
			}
		}
		for (Potassco::AtomSpan::iterator it = Potassco::begin(head), end = Potassco::end(head); it != end; ++it) {
			atomState_.clearRule(*it);
		}
	}
	if (!d) {
		// no corresponding disjunction exists, create a new object
		// and link it to all atoms
		++stats.disjunctions[statsId_];
		d = PrgDisj::create((uint32)disjunctions_.size(), head);
		disjunctions_.push_back(d);
		PrgEdge edge = PrgEdge::newEdge(*d, PrgEdge::Choice);
		for (Potassco::AtomSpan::iterator it = Potassco::begin(head), end = Potassco::end(head); it != end; ++it) {
			getAtom(*it)->addSupport(edge);
		}
		if (headHash) {
			index_->disj.insert(IndexMap::value_type(headHash, d->id()));
		}
	}
	return d;
}